

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O2

void amrex::EB2::Build(Geometry *geom,int required_coarsening_level,int max_coarsening_level,
                      int ngrow,bool build_coarse_level_by_coarsening,bool a_extend_domain_face,
                      int a_num_coarsen_opt)

{
  bool bVar1;
  IndexSpaceSTL *this;
  undefined4 in_register_00000014;
  long lVar2;
  string *this_00;
  uint uVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<double> __l_00;
  bool has_fluid_inside_1;
  int direction;
  undefined8 local_178;
  bool has_fluid_inside;
  allocator_type local_15a;
  allocator local_159;
  RealArray lo;
  RealArray hi;
  string geom_type;
  GeometryShop<amrex::EB2::AllRegularIF,_int> gshop;
  undefined1 auStack_f0 [24];
  double dStack_d8;
  undefined8 local_d0;
  Real local_c8;
  int local_c0;
  string local_b8 [40];
  ParmParse pp;
  
  local_178 = CONCAT44(in_register_00000014,max_coarsening_level);
  std::__cxx11::string::string((string *)&gshop,"eb2",(allocator *)&geom_type);
  ParmParse::ParmParse(&pp,(string *)&gshop);
  std::__cxx11::string::~string((string *)&gshop);
  geom_type._M_dataplus._M_p = (pointer)&geom_type.field_2;
  geom_type._M_string_length = 0;
  geom_type.field_2._M_local_buf[0] = '\0';
  ParmParse::get(&pp,"geom_type",&geom_type,0);
  bVar1 = std::operator==(&geom_type,"all_regular");
  if (bVar1) {
    gshop = (GeometryShop<amrex::EB2::AllRegularIF,_int>)((ulong)gshop & 0xffffffff);
    Build<amrex::EB2::GeometryShop<amrex::EB2::AllRegularIF,int>>
              (&gshop,geom,required_coarsening_level,(int)local_178,ngrow,
               build_coarse_level_by_coarsening,a_extend_domain_face,a_num_coarsen_opt);
    goto LAB_005a0e6c;
  }
  bVar1 = std::operator==(&geom_type,"box");
  if (bVar1) {
    ParmParse::get<double,3ul>(&pp,"box_lo",&lo);
    ParmParse::get<double,3ul>(&pp,"box_hi",&hi);
    ParmParse::get(&pp,"box_has_fluid_inside",&has_fluid_inside,0);
    auStack_f0._8_8_ = CONCAT71(lo._M_elems[2]._1_7_,lo._M_elems[2]._0_1_);
    if (has_fluid_inside == false) {
      uVar3 = 0xbff00000;
    }
    else {
      uVar3 = 0x3ff00000;
    }
    gshop = (GeometryShop<amrex::EB2::AllRegularIF,_int>)lo._M_elems[0];
    auStack_f0._0_8_ = lo._M_elems[1];
    auStack_f0._16_8_ = hi._M_elems[0];
    dStack_d8 = hi._M_elems[1];
    local_d0 = hi._M_elems[2];
    local_c8 = (Real)((ulong)uVar3 << 0x20);
    local_c0 = 0;
    Build<amrex::EB2::GeometryShop<amrex::EB2::BoxIF,int>>
              ((GeometryShop<amrex::EB2::BoxIF,_int> *)&gshop,geom,required_coarsening_level,
               (int)local_178,ngrow,build_coarse_level_by_coarsening,a_extend_domain_face,
               a_num_coarsen_opt);
    goto LAB_005a0e6c;
  }
  bVar1 = std::operator==(&geom_type,"cylinder");
  if (bVar1) {
    ParmParse::get<double,3ul>(&pp,"cylinder_center",&lo);
    ParmParse::get(&pp,"cylinder_radius",hi._M_elems,0);
    _has_fluid_inside = (GeometryShop<amrex::EB2::AllRegularIF,_int>)0xbff0000000000000;
    ParmParse::queryAdd<double,_0>(&pp,"cylinder_height",(double *)&has_fluid_inside);
    ParmParse::get(&pp,"cylinder_direction",&direction,0);
    if (2 < (uint)direction) {
      Assert_host("direction >=0 && direction < 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2.cpp"
                  ,0x83,"\"eb2.cylinder_direction is invalid\"");
    }
    ParmParse::get(&pp,"cylinder_has_fluid_inside",&has_fluid_inside_1,0);
    local_d0 = (double)CONCAT71(lo._M_elems[2]._1_7_,lo._M_elems[2]._0_1_);
    if (has_fluid_inside_1 == false) {
      uVar3 = 0xbff00000;
    }
    else {
      uVar3 = 0x3ff00000;
    }
    gshop = (GeometryShop<amrex::EB2::AllRegularIF,_int>)hi._M_elems[0];
    auStack_f0._0_8_ = _has_fluid_inside;
    auStack_f0._8_4_ = direction;
    auStack_f0._16_8_ = lo._M_elems[0];
    dStack_d8 = lo._M_elems[1];
    local_c8 = (Real)((ulong)uVar3 << 0x20);
    local_c0 = 0;
    Build<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>
              ((GeometryShop<amrex::EB2::CylinderIF,_int> *)&gshop,geom,required_coarsening_level,
               (int)local_178,ngrow,build_coarse_level_by_coarsening,a_extend_domain_face,
               a_num_coarsen_opt);
    goto LAB_005a0e6c;
  }
  bVar1 = std::operator==(&geom_type,"plane");
  if (bVar1) {
    ParmParse::get<double,3ul>(&pp,"plane_point",&lo);
    ParmParse::get<double,3ul>(&pp,"plane_normal",&hi);
    auStack_f0._8_8_ = CONCAT71(lo._M_elems[2]._1_7_,lo._M_elems[2]._0_1_);
    gshop = (GeometryShop<amrex::EB2::AllRegularIF,_int>)lo._M_elems[0];
    auStack_f0._0_8_ = lo._M_elems[1];
    auStack_f0._16_8_ = hi._M_elems[0];
    dStack_d8 = hi._M_elems[1];
    local_d0 = hi._M_elems[2];
    local_c8 = 1.0;
    local_c0 = 0;
    Build<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,int>>
              ((GeometryShop<amrex::EB2::PlaneIF,_int> *)&gshop,geom,required_coarsening_level,
               (int)local_178,ngrow,build_coarse_level_by_coarsening,a_extend_domain_face,
               a_num_coarsen_opt);
    goto LAB_005a0e6c;
  }
  bVar1 = std::operator==(&geom_type,"sphere");
  if (bVar1) {
    ParmParse::get<double,3ul>(&pp,"sphere_center",&lo);
    ParmParse::get(&pp,"sphere_radius",hi._M_elems,0);
    ParmParse::get(&pp,"sphere_has_fluid_inside",&has_fluid_inside,0);
    auStack_f0._16_8_ = CONCAT71(lo._M_elems[2]._1_7_,lo._M_elems[2]._0_1_);
    if (has_fluid_inside == false) {
      uVar3 = 0xbff00000;
    }
    else {
      uVar3 = 0x3ff00000;
    }
    gshop = (GeometryShop<amrex::EB2::AllRegularIF,_int>)hi._M_elems[0];
    auStack_f0._0_8_ = lo._M_elems[0];
    auStack_f0._8_8_ = lo._M_elems[1];
    dStack_d8 = (double)((ulong)uVar3 << 0x20);
    local_d0 = (double)((ulong)local_d0._4_4_ << 0x20);
    Build<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>
              ((GeometryShop<amrex::EB2::SphereIF,_int> *)&gshop,geom,required_coarsening_level,
               (int)local_178,ngrow,build_coarse_level_by_coarsening,a_extend_domain_face,
               a_num_coarsen_opt);
    goto LAB_005a0e6c;
  }
  bVar1 = std::operator==(&geom_type,"torus");
  if (bVar1) {
    ParmParse::get<double,3ul>(&pp,"torus_center",&lo);
    ParmParse::get(&pp,"torus_small_radius",hi._M_elems,0);
    ParmParse::get(&pp,"torus_large_radius",(double *)&has_fluid_inside,0);
    dStack_d8 = (double)CONCAT71(lo._M_elems[2]._1_7_,lo._M_elems[2]._0_1_);
    gshop = _has_fluid_inside;
    auStack_f0._0_8_ = hi._M_elems[0];
    auStack_f0._8_8_ = lo._M_elems[0];
    auStack_f0._16_8_ = lo._M_elems[1];
    local_c8 = 1.0;
    local_c0 = 0;
    Build<amrex::EB2::GeometryShop<amrex::EB2::TorusIF,int>>
              ((GeometryShop<amrex::EB2::TorusIF,_int> *)&gshop,geom,required_coarsening_level,
               (int)local_178,ngrow,build_coarse_level_by_coarsening,a_extend_domain_face,
               a_num_coarsen_opt);
    goto LAB_005a0e6c;
  }
  bVar1 = std::operator==(&geom_type,"parser");
  if (bVar1) {
    lo._M_elems[0] = (double)(lo._M_elems + 2);
    lo._M_elems[1] = 0.0;
    lo._M_elems[2]._0_1_ = 0;
    ParmParse::get(&pp,"parser_function",(string *)&lo,0);
    Parser::Parser((Parser *)&has_fluid_inside,(string *)&lo);
    std::__cxx11::string::string((string *)&gshop,"x",(allocator *)&direction);
    std::__cxx11::string::string((string *)&dStack_d8,"y",(allocator *)&has_fluid_inside_1);
    std::__cxx11::string::string(local_b8,"z",&local_159);
    __l._M_len = 3;
    __l._M_array = (iterator)&gshop;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&hi,__l,&local_15a);
    Parser::registerVariables
              ((Parser *)&has_fluid_inside,
               (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&hi);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&hi);
    lVar2 = 0x40;
    do {
      std::__cxx11::string::~string((string *)(&gshop.field_0x0 + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    gshop = (GeometryShop<amrex::EB2::AllRegularIF,_int>)
            Parser::compileHost<3>((Parser *)&has_fluid_inside);
    std::__shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2> *)auStack_f0,
               (__shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2> *)&has_fluid_inside);
    Build<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>
              ((GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *)&gshop,geom,
               required_coarsening_level,(int)local_178,ngrow,build_coarse_level_by_coarsening,
               a_extend_domain_face,a_num_coarsen_opt);
    Parser::~Parser((Parser *)auStack_f0);
    Parser::~Parser((Parser *)&has_fluid_inside);
LAB_005a0e62:
    this_00 = (string *)&lo;
  }
  else {
    bVar1 = std::operator==(&geom_type,"stl");
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lo,
                     "geom_type ",&geom_type);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gshop,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lo,
                     " not supported");
      Abort((string *)&gshop);
      std::__cxx11::string::~string((string *)&gshop);
      goto LAB_005a0e62;
    }
    gshop = (GeometryShop<amrex::EB2::AllRegularIF,_int>)((long)auStack_f0 + 8);
    auStack_f0._0_8_ = (GeometryShop<amrex::EB2::AllRegularIF,_int>)0x0;
    auStack_f0._8_8_ = auStack_f0._8_8_ & 0xffffffffffffff00;
    ParmParse::get(&pp,"stl_file",(string *)&gshop,0);
    _has_fluid_inside = (GeometryShop<amrex::EB2::AllRegularIF,_int>)0x3ff0000000000000;
    ParmParse::queryAdd<double,_0>(&pp,"stl_scale",(double *)&has_fluid_inside);
    hi._M_elems[0] = 0.0;
    hi._M_elems[1] = 0.0;
    hi._M_elems[2] = 0.0;
    __l_00._M_len = 3;
    __l_00._M_array = hi._M_elems;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&lo,__l_00,(allocator_type *)&direction);
    ParmParse::queryAdd<double>(&pp,"stl_center",(vector<double,_std::allocator<double>_> *)&lo);
    direction = 0;
    ParmParse::queryAdd<int,_0>(&pp,"stl_reverse_normal",&direction);
    this = (IndexSpaceSTL *)operator_new(0x68);
    hi._M_elems[0] = *(double *)lo._M_elems[0];
    hi._M_elems[1] = *(double *)((long)lo._M_elems[0] + 8);
    hi._M_elems[2] = *(double *)((long)lo._M_elems[0] + 0x10);
    IndexSpaceSTL::IndexSpaceSTL
              (this,(string *)&gshop,(Real)_has_fluid_inside,&hi,direction,geom,
               required_coarsening_level,(int)local_178,ngrow,build_coarse_level_by_coarsening,
               a_extend_domain_face,a_num_coarsen_opt);
    IndexSpace::push((IndexSpace *)0x5a0e05);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&lo);
    this_00 = (string *)&gshop;
  }
  std::__cxx11::string::~string(this_00);
LAB_005a0e6c:
  std::__cxx11::string::~string((string *)&geom_type);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  return;
}

Assistant:

void
Build (const Geometry& geom, int required_coarsening_level,
       int max_coarsening_level, int ngrow, bool build_coarse_level_by_coarsening,
       bool a_extend_domain_face, int a_num_coarsen_opt)
{
    ParmParse pp("eb2");
    std::string geom_type;
    pp.get("geom_type", geom_type);

    if (geom_type == "all_regular")
    {
        EB2::AllRegularIF rif;
        EB2::GeometryShop<EB2::AllRegularIF> gshop(rif);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "box")
    {
        RealArray lo;
        pp.get("box_lo", lo);

        RealArray hi;
        pp.get("box_hi", hi);

        bool has_fluid_inside;
        pp.get("box_has_fluid_inside", has_fluid_inside);

        EB2::BoxIF bf(lo, hi, has_fluid_inside);

        EB2::GeometryShop<EB2::BoxIF> gshop(bf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "cylinder")
    {
        RealArray center;
        pp.get("cylinder_center", center);

        Real radius;
        pp.get("cylinder_radius", radius);

        Real height = -1.0;
        pp.queryAdd("cylinder_height", height);

        int direction;
        pp.get("cylinder_direction", direction);
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(direction >=0 && direction < 3,
                                         "eb2.cylinder_direction is invalid");

        bool has_fluid_inside;
        pp.get("cylinder_has_fluid_inside", has_fluid_inside);

        EB2::CylinderIF cf(radius, height, direction, center, has_fluid_inside);

        EB2::GeometryShop<EB2::CylinderIF> gshop(cf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "plane")
    {
        RealArray point;
        pp.get("plane_point", point);

        RealArray normal;
        pp.get("plane_normal", normal);

        EB2::PlaneIF pf(point, normal);

        EB2::GeometryShop<EB2::PlaneIF> gshop(pf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "sphere")
    {
        RealArray center;
        pp.get("sphere_center", center);

        Real radius;
        pp.get("sphere_radius", radius);

        bool has_fluid_inside;
        pp.get("sphere_has_fluid_inside", has_fluid_inside);

        EB2::SphereIF sf(radius, center, has_fluid_inside);

        EB2::GeometryShop<EB2::SphereIF> gshop(sf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "torus")
    {
        RealArray center;
        pp.get("torus_center", center);

        Real small_radius;
        pp.get("torus_small_radius", small_radius);

        Real large_radius;
        pp.get("torus_large_radius", large_radius);

        bool has_fluid_inside = true;

        EB2::TorusIF sf(large_radius, small_radius, center, has_fluid_inside);

        EB2::GeometryShop<EB2::TorusIF> gshop(sf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "parser")
    {
        std::string fn_string;
        pp.get("parser_function", fn_string);
        Parser parser(fn_string);
        parser.registerVariables({"x","y","z"});
        EB2::ParserIF pif(parser.compile<3>());
        EB2::GeometryShop<EB2::ParserIF,Parser> gshop(pif,parser);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "stl")
    {
        std::string stl_file;
        pp.get("stl_file", stl_file);
        Real stl_scale = 1._rt;
        pp.queryAdd("stl_scale", stl_scale);
        std::vector<Real> stl_center{0.0_rt, 0.0_rt, 0.0_rt};
        pp.queryAdd("stl_center", stl_center);
        int stl_reverse_normal = 0;
        pp.queryAdd("stl_reverse_normal", stl_reverse_normal);
        IndexSpace::push(new IndexSpaceSTL(stl_file, stl_scale,
                                           {stl_center[0], stl_center[1], stl_center[2]},
                                           stl_reverse_normal,
                                           geom, required_coarsening_level,
                                           max_coarsening_level, ngrow,
                                           build_coarse_level_by_coarsening,
                                           a_extend_domain_face,
                                           a_num_coarsen_opt));
    }
    else
    {
        amrex::Abort("geom_type "+geom_type+ " not supported");
    }
}